

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgztexture.cpp
# Opt level: O3

void __thiscall
FIMGZTexture::FIMGZTexture(FIMGZTexture *this,int lumpnum,WORD w,WORD h,SWORD l,SWORD t)

{
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FIMGZTexture_0088c780;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  FWadCollection::GetLumpName(&Wads,&(this->super_FTexture).Name,lumpnum);
  (this->super_FTexture).Width = w;
  (this->super_FTexture).Height = h;
  (this->super_FTexture).LeftOffset = l;
  (this->super_FTexture).TopOffset = t;
  FTexture::CalcBitSize(&this->super_FTexture);
  return;
}

Assistant:

FIMGZTexture::FIMGZTexture (int lumpnum, WORD w, WORD h, SWORD l, SWORD t)
	: FTexture(NULL, lumpnum), Pixels(0), Spans(0)
{
	Wads.GetLumpName (Name, lumpnum);
	Width = w;
	Height = h;
	LeftOffset = l;
	TopOffset = t;
	CalcBitSize ();
}